

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddApply.c
# Opt level: O1

DdNode * Cudd_addOr(DdManager *dd,DdNode **f,DdNode **g)

{
  DdNode *pDVar1;
  DdNode *pDVar2;
  DdNode *pDVar3;
  
  pDVar1 = *f;
  pDVar2 = *g;
  pDVar3 = dd->one;
  if (pDVar2 == pDVar3 || pDVar1 == pDVar3) {
    return pDVar3;
  }
  if (pDVar1->index == 0x7fffffff) {
    return pDVar2;
  }
  if (pDVar1 == pDVar2 || pDVar2->index == 0x7fffffff) {
    return pDVar1;
  }
  if (pDVar2 < pDVar1) {
    *f = pDVar2;
    *g = pDVar1;
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode *
Cudd_addOr(
  DdManager * dd,
  DdNode ** f,
  DdNode ** g)
{
    DdNode *F, *G;

    F = *f; G = *g;
    if (F == DD_ONE(dd) || G == DD_ONE(dd)) return(DD_ONE(dd));
    if (cuddIsConstant(F)) return(G);
    if (cuddIsConstant(G)) return(F);
    if (F == G) return(F);
    if (F > G) { /* swap f and g */
        *f = G;
        *g = F;
    }
    return(NULL);

}